

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O3

uint __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
::bubbleDown(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
             *this,uint index)

{
  Binding *pBVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  uint uVar7;
  Binding *pBVar8;
  Binding *pBVar9;
  uint uVar10;
  
  uVar6 = (ulong)index;
  uVar7 = index * 2;
  uVar10 = this->_size;
  if (uVar7 <= uVar10) {
    do {
      pBVar8 = this->_data1;
      pBVar1 = pBVar8 + uVar6;
      if (uVar7 == uVar10) {
        uVar10 = pBVar1->var;
LAB_00373a0f:
        if (pBVar8[uVar7].var <= uVar10) {
          return (uint)uVar6;
        }
        pBVar9 = pBVar8 + uVar7;
        pBVar1 = pBVar8 + uVar6;
        uVar10 = pBVar1->var;
        uVar5 = *(undefined4 *)&pBVar1->field_0x4;
        uVar2 = (pBVar1->term)._content;
        uVar4 = *(undefined4 *)&pBVar9->field_0x4;
        uVar3 = (pBVar9->term)._content;
        pBVar8 = pBVar8 + uVar6;
        pBVar8->var = pBVar9->var;
        *(undefined4 *)&pBVar8->field_0x4 = uVar4;
        (pBVar8->term)._content = uVar3;
        pBVar9->var = uVar10;
        *(undefined4 *)&pBVar9->field_0x4 = uVar5;
        (pBVar9->term)._content = uVar2;
        index = uVar7;
      }
      else {
        index = uVar7 | 1;
        uVar10 = pBVar1->var;
        if (pBVar8[index].var <= uVar10) goto LAB_00373a0f;
        if (pBVar8[index].var < pBVar8[uVar7].var) {
          pBVar8 = pBVar8 + uVar7;
          uVar10 = pBVar1->var;
          uVar5 = *(undefined4 *)&pBVar1->field_0x4;
          uVar2 = (pBVar1->term)._content;
          uVar4 = *(undefined4 *)&pBVar8->field_0x4;
          uVar3 = (pBVar8->term)._content;
          pBVar1->var = pBVar8->var;
          *(undefined4 *)&pBVar1->field_0x4 = uVar4;
          (pBVar1->term)._content = uVar3;
          pBVar8->var = uVar10;
          *(undefined4 *)&pBVar8->field_0x4 = uVar5;
          (pBVar8->term)._content = uVar2;
          index = uVar7;
        }
        else {
          pBVar8 = pBVar8 + index;
          uVar10 = pBVar1->var;
          uVar5 = *(undefined4 *)&pBVar1->field_0x4;
          uVar2 = (pBVar1->term)._content;
          uVar4 = *(undefined4 *)&pBVar8->field_0x4;
          uVar3 = (pBVar8->term)._content;
          pBVar1->var = pBVar8->var;
          *(undefined4 *)&pBVar1->field_0x4 = uVar4;
          (pBVar1->term)._content = uVar3;
          pBVar8->var = uVar10;
          *(undefined4 *)&pBVar8->field_0x4 = uVar5;
          (pBVar8->term)._content = uVar2;
        }
      }
      uVar6 = (ulong)index;
      uVar7 = index * 2;
      uVar10 = this->_size;
    } while (uVar7 <= uVar10);
  }
  return index;
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }